

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBasicLogMacros.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* (anonymous_namespace)::getEventsFromDefaultSession_abi_cxx11_(char *eventFormat)

{
  Enum EVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  Expression_lhs<unsigned_long> EVar2;
  Result *in_stack_00000030;
  char *in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  Enum in_stack_00000054;
  ConsumeResult cr;
  TestStream stream;
  char *in_stack_00000270;
  TestStream *in_stack_00000278;
  unsigned_long *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  ExpressionDecomposer local_9c;
  unsigned_long local_98;
  Enum local_90;
  unsigned_long *in_stack_ffffffffffffffa0;
  Expression_lhs<unsigned_long> *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> local_30 [2];
  
  TestStream::TestStream
            ((TestStream *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  binlog::consume<TestStream>
            ((TestStream *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9c,DT_CHECK);
  std::vector<char,_std::allocator<char>_>::size(local_30);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff18);
  local_98 = EVar2.lhs;
  EVar1 = EVar2.m_at;
  local_90 = EVar1;
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  doctest::detail::decomp_assert
            (in_stack_00000054,in_stack_00000048,in_stack_00000044,in_stack_00000038,
             in_stack_00000030);
  doctest::detail::Result::~Result((Result *)0x247ea2);
  streamToEvents_abi_cxx11_(in_stack_00000278,in_stack_00000270);
  TestStream::~TestStream((TestStream *)CONCAT44(EVar1,in_stack_ffffffffffffff20));
  return in_RDI;
}

Assistant:

std::vector<std::string> getEventsFromDefaultSession(const char* eventFormat)
{
  TestStream stream;
  const binlog::Session::ConsumeResult cr = binlog::consume(stream);
  CHECK(stream.buffer.size() == cr.bytesConsumed);
  return streamToEvents(stream, eventFormat);
}